

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

unsigned_long quick_get_ulong(FMFieldPtr iofield,void *data)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  
  uVar1 = 0;
  if (iofield->size - 1U < 8) {
    puVar2 = (unsigned_long *)((long)data + iofield->offset);
    switch(iofield->size) {
    case 1:
      return (ulong)(byte)*puVar2;
    case 2:
      return (ulong)(ushort)*puVar2;
    case 4:
      return (ulong)(uint)*puVar2;
    case 8:
      uVar1 = *puVar2;
    }
  }
  return uVar1;
}

Assistant:

static size_t
quick_get_ulong(FMFieldPtr iofield, void *data)
{
    data = (void *) ((char *) data + iofield->offset);
    /* only used when field type is an integer and aligned by its size */
    switch (iofield->size) {
    case 1:
	return (unsigned long) (*((unsigned char *) data));
    case 2:
	return (unsigned long) (*((unsigned short *) data));
    case 4:
	return (unsigned long) (*((unsigned int *) data));
    case 8:
#if SIZEOF_LONG == 8
	if ((((long) data) & 0x0f) == 0) {
	    /* properly aligned */
	    return (unsigned long) (*((unsigned long *) data));
	} else {
	    union {
		unsigned long tmp;
		int tmpi[2];
	    } u;
	    u.tmpi[0] = ((int *) data)[0];
	    u.tmpi[1] = ((int *) data)[1];
	    return u.tmp;
	}
#else
	/* must be fetching 4 bytes of the 8 available */
	if (WORDS_BIGENDIAN)
	    return (*(((unsigned long *) data) +1));
	else
	    return (*((unsigned long *) data));

#endif
    }
    return 0;
}